

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

GLfloat __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::readPixel(FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLfloat red;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  red = -1.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,1,1,0x1903,0x1406,&red);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x26f);
  return red;
}

Assistant:

glw::GLfloat gl4cts::ConditionalRenderInverted::FunctionalTest::readPixel()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLfloat red = -1.f;

	gl.readPixels(0, 0, 1, 1, GL_RED, GL_FLOAT, &red);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	return red;
}